

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextSemiOrAntiJoin<false>
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  idx_t iVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  idx_t count_p;
  idx_t iVar3;
  SelectionVector sel;
  SelectionVector local_38;
  
  SelectionVector::SelectionVector(&local_38,0x800);
  iVar1 = keys->count;
  if (iVar1 != 0) {
    _Var2._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    iVar3 = 0;
    count_p = 0;
    do {
      if (_Var2._M_head_impl[iVar3] == false) {
        local_38.sel_vector[count_p] = (sel_t)iVar3;
        count_p = count_p + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
    if (count_p != 0) {
      DataChunk::Slice(result,left,&local_38,count_p,0);
    }
  }
  if (local_38.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ScanStructure::NextSemiOrAntiJoin(DataChunk &keys, DataChunk &left, DataChunk &result) {
	D_ASSERT(left.ColumnCount() == result.ColumnCount());
	// create the selection vector from the matches that were found
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	idx_t result_count = 0;
	for (idx_t i = 0; i < keys.size(); i++) {
		if (found_match[i] == MATCH) {
			// part of the result
			sel.set_index(result_count++, i);
		}
	}
	// construct the final result
	if (result_count > 0) {
		// we only return the columns on the left side
		// reference the columns of the left side from the result
		result.Slice(left, sel, result_count);
	} else {
		D_ASSERT(result.size() == 0);
	}
}